

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

float GetDraggedColumnOffset(int column_index)

{
  ImGuiContext *pIVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  pIVar1 = GImGui;
  if (column_index < 1) {
    __assert_fail("column_index > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                  ,0x2436,"float GetDraggedColumnOffset(int)");
  }
  if (GImGui->ActiveId == (GImGui->CurrentWindow->DC).ColumnsSetId + column_index) {
    fVar3 = ((GImGui->IO).MousePos.x - (GImGui->ActiveIdClickOffset).x) -
            (GImGui->CurrentWindow->Pos).x;
    fVar4 = ImGui::GetColumnOffset(column_index + -1);
    fVar4 = fVar4 + (pIVar1->Style).ColumnsMinSpacing;
    fVar5 = ImGui::GetColumnOffset(column_index + 1);
    fVar5 = fVar5 - (pIVar1->Style).ColumnsMinSpacing;
    if (fVar3 <= fVar5) {
      fVar5 = fVar3;
    }
    uVar2 = -(uint)(fVar3 < fVar4);
    return (float)(int)(float)(uVar2 & (uint)fVar4 | ~uVar2 & (uint)fVar5);
  }
  __assert_fail("g.ActiveId == window->DC.ColumnsSetId + ImGuiID(column_index)",
                "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                ,0x2437,"float GetDraggedColumnOffset(int)");
}

Assistant:

static float GetDraggedColumnOffset(int column_index)
{
    // Active (dragged) column always follow mouse. The reason we need this is that dragging a column to the right edge of an auto-resizing
    // window creates a feedback loop because we store normalized positions. So while dragging we enforce absolute positioning.
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = ImGui::GetCurrentWindowRead();
    IM_ASSERT(column_index > 0); // We cannot drag column 0. If you get this assert you may have a conflict between the ID of your columns and another widgets.
    IM_ASSERT(g.ActiveId == window->DC.ColumnsSetId + ImGuiID(column_index));

    float x = g.IO.MousePos.x - g.ActiveIdClickOffset.x - window->Pos.x;
    x = ImClamp(x, ImGui::GetColumnOffset(column_index-1)+g.Style.ColumnsMinSpacing, ImGui::GetColumnOffset(column_index+1)-g.Style.ColumnsMinSpacing);

    return (float)(int)x;
}